

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O3

bool tinyusdz::ToPrimSpec(MtlxModel *model,PrimSpec *ps,string *err)

{
  int iVar1;
  ostream *poVar2;
  mapped_type *this;
  _Base_ptr p_Var3;
  char *pcVar4;
  _Rb_tree_header *p_Var5;
  PrimSpec shaders;
  PrimSpec materials;
  PrimSpec root;
  undefined1 local_10e0 [40];
  string local_10b8 [8];
  char *local_10b0;
  undefined1 local_b78 [1504];
  undefined1 local_598 [40];
  undefined1 local_570 [8];
  char *local_568;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> local_550 [54];
  
  iVar1 = ::std::__cxx11::string::compare((char *)&model->shader_name);
  if (iVar1 == 0) {
    pcVar4 = "UsdPreviewSurface";
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&model->shader_name);
    if (iVar1 != 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b78);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b78,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b78,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b78,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b78,"ToPrimSpec",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b78,"():",3);
      poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_b78,0x3bc);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b78,"Unsupported shader_name: ",0x19);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_b78,(model->shader_name)._M_dataplus._M_p,
                          (model->shader_name)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_10e0._0_8_);
        if ((undefined1 *)local_10e0._0_8_ != local_10e0 + 0x10) {
          operator_delete((void *)local_10e0._0_8_,CONCAT71(local_10e0._17_7_,local_10e0[0x10]) + 1)
          ;
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b78);
      ::std::ios_base::~ios_base((ios_base *)(local_b78 + 0x70));
      return false;
    }
    pcVar4 = "AutodeskStandardSurface";
  }
  local_10e0[0x10] = '\0';
  local_10e0._8_8_ = (pointer)0x0;
  local_10e0._0_8_ = local_10e0 + 0x10;
  ::std::__cxx11::string::_M_replace((ulong)local_10e0,0,(char *)0x0,(ulong)pcVar4);
  detail::MakeProperty<tinyusdz::Token>((Property *)local_b78,(Token *)local_10e0);
  local_598._0_8_ = local_598 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"info:id","");
  this = ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
         ::operator[](&ps->_props,(key_type *)local_598);
  Property::operator=(this,(Property *)local_b78);
  if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
    operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
  }
  Property::~Property((Property *)local_b78);
  if ((undefined1 *)local_10e0._0_8_ != local_10e0 + 0x10) {
    operator_delete((void *)local_10e0._0_8_,CONCAT71(local_10e0._17_7_,local_10e0[0x10]) + 1);
  }
  PrimSpec::PrimSpec((PrimSpec *)local_b78);
  ::std::__cxx11::string::_M_replace((ulong)(local_b78 + 0x28),0,(char *)local_b78._48_8_,0x3e664c);
  local_b78._0_4_ = Def;
  p_Var3 = (model->surface_materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(model->surface_materials)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      PrimSpec::PrimSpec((PrimSpec *)local_10e0);
      local_10e0._0_8_ = local_10e0._0_8_ & 0xffffffff00000000;
      ::std::__cxx11::string::_M_replace
                ((ulong)(local_10e0 + 8),0,(char *)CONCAT71(local_10e0._17_7_,local_10e0[0x10]),
                 0x3d1008);
      ::std::__cxx11::string::_M_assign(local_10b8);
      PrimSpec::~PrimSpec((PrimSpec *)local_10e0);
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  PrimSpec::PrimSpec((PrimSpec *)local_10e0);
  ::std::__cxx11::string::_M_replace((ulong)local_10b8,0,local_10b0,0x3e6656);
  local_10e0._0_8_ = local_10e0._0_8_ & 0xffffffff00000000;
  PrimSpec::PrimSpec((PrimSpec *)local_598);
  ::std::__cxx11::string::_M_replace((ulong)local_570,0,local_568,0x3d652d);
  local_598._0_8_ = local_598._0_8_ & 0xffffffff00000000;
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
            (local_550,(value_type *)local_b78);
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
            (local_550,(PrimSpec *)local_10e0);
  if ((PrimSpec *)local_598 != ps) {
    PrimSpec::MoveFrom(ps,(PrimSpec *)local_598);
  }
  PrimSpec::~PrimSpec((PrimSpec *)local_598);
  PrimSpec::~PrimSpec((PrimSpec *)local_10e0);
  PrimSpec::~PrimSpec((PrimSpec *)local_b78);
  return true;
}

Assistant:

bool ToPrimSpec(const MtlxModel &model, PrimSpec &ps, std::string *err) {
  //
  // def "MaterialX" {
  //
  //   def "Materials" {
  //     def Material ... {
  //     }
  //   }
  //   def "Shaders" {
  //   }
  constexpr auto kAutodeskStandardSurface = "AutodeskStandardSurface";

  if (model.shader_name == kUsdPreviewSurface) {
    ps.props()["info:id"] =
        detail::MakeProperty(value::token(kUsdPreviewSurface));
  } else if (model.shader_name == kAutodeskStandardSurface) {
    ps.props()["info:id"] =
        detail::MakeProperty(value::token(kAutodeskStandardSurface));
  } else {
    PUSH_ERROR_AND_RETURN("Unsupported shader_name: " << model.shader_name);
  }

  PrimSpec materials;
  materials.name() = "Materials";
  materials.specifier() = Specifier::Def;

  for (const auto &item : model.surface_materials) {
    PrimSpec material;
    material.specifier() = Specifier::Def;
    material.typeName() = "Material";

    material.name() = item.second.name;
  }

  PrimSpec shaders;
  shaders.name() = "Shaders";
  shaders.specifier() = Specifier::Def;

  PrimSpec root;
  root.name() = "MaterialX";
  root.specifier() = Specifier::Def;

  root.children().push_back(materials);
  root.children().push_back(shaders);

  ps = std::move(root);

  return true;
}